

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermSymbol * __thiscall
glslang::HlslParseContext::makeInternalVariableNode
          (HlslParseContext *this,TSourceLoc *loc,char *name,TType *type)

{
  int iVar1;
  TVariable *variable;
  undefined4 extraout_var;
  TQualifier *this_00;
  TIntermSymbol *pTVar2;
  TVariable *tmpVar;
  TType *type_local;
  char *name_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  variable = makeInternalVariable(this,name,type);
  iVar1 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
  this_00 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))();
  TQualifier::makeTemporary(this_00);
  pTVar2 = TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc
                     );
  return pTVar2;
}

Assistant:

TIntermSymbol* HlslParseContext::makeInternalVariableNode(const TSourceLoc& loc, const char* name,
                                                          const TType& type) const
{
    TVariable* tmpVar = makeInternalVariable(name, type);
    tmpVar->getWritableType().getQualifier().makeTemporary();

    return intermediate.addSymbol(*tmpVar, loc);
}